

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RollingBuffer_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::RollingBuffer::RollingBuffer(RollingBuffer *this,size_t growth)

{
  _Elt_pointer in_RSI;
  deque<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_> *in_RDI;
  RollingBuffer *in_stack_00000070;
  value_type *in_stack_ffffffffffffffa8;
  
  (in_RDI->
  super__Deque_base<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>).
  _M_impl.super__Deque_impl_data._M_start._M_last = in_RSI;
  std::deque<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>::deque
            ((deque<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_> *
             )0x2b2aa7);
  ByteArray::ByteArray((ByteArray *)in_RDI);
  std::deque<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>::
  push_back(in_RDI,in_stack_ffffffffffffffa8);
  ByteArray::~ByteArray((ByteArray *)0x2b2ace);
  Clear(in_stack_00000070);
  return;
}

Assistant:

RollingBuffer::RollingBuffer(std::size_t growth)
    : m_bufferGrowth(growth)
{
    // buffer always contains at least 1 (maybe empty) byte array
    m_data.push_back(ByteArray());

    // set cleared state
    Clear();
}